

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::str<char_const(&)[18],kj::StringPtr&,kj::String&,char_const(&)[17]>
          (String *__return_storage_ptr__,kj *this,char (*params) [18],StringPtr *params_1,
          String *params_2,char (*params_3) [17])

{
  char *pcVar1;
  ArrayPtr<const_char> local_68;
  kj *local_58;
  size_t local_50;
  ArrayPtr<const_char> local_48;
  ArrayPtr<const_char> local_38;
  
  local_50 = strlen((char *)this);
  local_68.ptr = *(char **)*params;
  local_68.size_ = *(long *)(*params + 8) - 1;
  pcVar1 = (char *)(params_1->content).size_;
  local_38.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_38.ptr = (params_1->content).ptr;
  }
  local_38.size_ = (size_t)(char *)0x0;
  if (pcVar1 != (char *)0x0) {
    local_38.size_ = (size_t)(pcVar1 + -1);
  }
  local_58 = this;
  local_48.size_ = strlen((char *)params_2);
  local_48.ptr = (char *)params_2;
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_58,&local_68,&local_38,&local_48,
             (ArrayPtr<const_char> *)params_3);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}